

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int lj_ffh_string_sub(lua_State *L)

{
  TValue *pTVar1;
  int32_t iVar2;
  
  lj_lib_checkstr(L,1);
  lj_lib_checkint(L,2);
  pTVar1 = L->base;
  iVar2 = lj_lib_optint(L,3,-1);
  pTVar1[2].n = (double)iVar2;
  return 0;
}

Assistant:

LJLIB_ASM(string_sub)		LJLIB_REC(string_range 1)
{
  lj_lib_checkstr(L, 1);
  lj_lib_checkint(L, 2);
  setintV(L->base+2, lj_lib_optint(L, 3, -1));
  return FFH_RETRY;
}